

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_uint(AMQP_VALUE value,uint32_t *uint_value)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  AMQP_VALUE_DATA *value_data;
  LOGGER_LOG l;
  int result;
  uint32_t *uint_value_local;
  AMQP_VALUE value_local;
  
  if ((value == (AMQP_VALUE)0x0) || (uint_value == (uint32_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_uint",0x197,1,"Bad arguments: value = %p, uint_value = %p",value,
                uint_value);
    }
    l._4_4_ = 0x198;
  }
  else if (value->type == AMQP_TYPE_UINT) {
    *uint_value = (value->value).uint_value;
    l._4_4_ = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_uint",0x1a0,1,"Value is not of type UINT");
    }
    l._4_4_ = 0x1a1;
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_uint(AMQP_VALUE value, uint32_t* uint_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_079: [If any of the arguments is NULL then amqpvalue_get_uint shall return a non-zero value.] */
    if ((value == NULL) ||
        (uint_value == NULL))
    {
        LogError("Bad arguments: value = %p, uint_value = %p",
            value, uint_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_048: [If the type of the value is not uint (was not created with amqpvalue_create_uint), then amqpvalue_get_uint shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_UINT)
        {
            LogError("Value is not of type UINT");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_046: [amqpvalue_get_uint shall fill in the uint_value argument the uint32_t value stored by the AMQP value indicated by the value argument.] */
            *uint_value = value_data->value.uint_value;

            /* Codes_SRS_AMQPVALUE_01_047: [On success amqpvalue_get_uint shall return 0.] */
            result = 0;
        }
    }

    return result;
}